

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_zeroing<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
               (void)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *column;
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  node_ptr plVar4;
  node_ptr plVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  pool<boost::default_user_allocator_malloc_free> *ppVar14;
  pointer p;
  pool<boost::default_user_allocator_malloc_free> *ppVar15;
  _Hash_node_base *p_Var16;
  int dim;
  ulong uVar17;
  ulong uVar18;
  pointer p_1;
  pointer p_00;
  _Hash_node_base *p_Var19;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_> m;
  char *local_200;
  char *local_1f8;
  key_equal local_1f0 [8];
  undefined8 local_1e8;
  shared_count sStack_1e0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_1d8;
  pool<boost::default_user_allocator_malloc_free> *local_1c0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1b8;
  int local_180;
  pool<boost::default_user_allocator_malloc_free> *local_178;
  undefined **local_170;
  undefined1 local_168;
  undefined8 *local_160;
  char **local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>>
            ();
  ppVar15 = (pool<boost::default_user_allocator_malloc_free> *)operator_new(0x38);
  (ppVar15->super_simple_segregated_storage<unsigned_long>).first = (void *)0x0;
  (ppVar15->list).ptr = (char *)0x0;
  (ppVar15->list).sz = 0;
  ppVar15->requested_size = 0x18;
  ppVar15->next_size = 0x20;
  ppVar15->start_size = 0x20;
  ppVar15->max_size = 0;
  local_1c0 = ppVar15;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_1b8,
               ((long)local_1d8.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1d8.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
               (hash<unsigned_int> *)&local_170,local_1f0,(allocator_type *)&local_200);
  local_180 = (int)((ulong)((long)local_1d8.
                                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1d8.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  local_178 = ppVar15;
  if (local_1d8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1d8.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar18 = 0;
    do {
      column = local_1d8.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar18;
      puVar2 = (column->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      puVar3 = (column->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dim = (int)((ulong)((long)puVar2 - (long)puVar3) >> 2) + -1;
      if (puVar2 == puVar3) {
        dim = 0;
      }
      Gudhi::persistence_matrix::
      Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
      ::_container_insert<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>
                  *)&local_1b8,column,(Index)uVar18,dim);
      uVar18 = (ulong)((Index)uVar18 + 1);
      uVar17 = ((long)local_1d8.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_1d8.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar18 <= uVar17 && uVar17 - uVar18 != 0);
  }
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x26d);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_1b8._M_bucket_count;
  uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar6,0);
  if (local_1b8._M_buckets[uVar18 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var19 = local_1b8._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var19[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var19 = p_Var19 + 4;
        p_Var16 = p_Var19;
        goto LAB_0012c057;
      }
      p_Var19 = p_Var19->_M_nxt;
    } while ((p_Var19 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var19[1]._M_nxt, (ulong)uVar1 % local_1b8._M_bucket_count == uVar18
            ));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_Var16 == (_Hash_node_base *)0x0) goto LAB_0012c802;
    if (*(int *)&p_Var16[2]._M_nxt == 1) break;
LAB_0012c057:
    p_Var16 = p_Var16->_M_nxt;
    if (p_Var16 == p_Var19) break;
  }
  local_1f0[0] = (key_equal)(p_Var16 != p_Var19);
  local_1e8 = 0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = "!m.is_zero_entry(3, 1)";
  local_1f8 = "";
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_001b8350;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_158 = &local_200;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x26e);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_1b8._M_bucket_count;
  uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar7,0);
  if (local_1b8._M_buckets[uVar18 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var19 = local_1b8._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var19[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        local_1f0[0] = (key_equal)
                       (p_Var19[4]._M_nxt != p_Var19 + 4 &&
                       p_Var19[4]._M_nxt != (_Hash_node_base *)0x0);
        local_1e8 = 0;
        sStack_1e0.pi_ = (sp_counted_base *)0x0;
        local_200 = "!m.is_zero_column(3)";
        local_1f8 = "";
        local_168 = 0;
        local_170 = &PTR__lazy_ostream_001b8350;
        local_160 = &boost::unit_test::lazy_ostream::inst;
        local_158 = &local_200;
        local_90 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_88 = "";
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_1e0);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_1b8._M_bucket_count;
        uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar8,0);
        if (local_1b8._M_buckets[uVar18 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0012c7f6;
        p_Var19 = local_1b8._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var19[1]._M_nxt;
        goto joined_r0x0012c246;
      }
      p_Var19 = p_Var19->_M_nxt;
    } while ((p_Var19 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var19[1]._M_nxt, (ulong)uVar1 % local_1b8._M_bucket_count == uVar18
            ));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_00 == (pointer)0x0) goto LAB_0012c802;
    if (p_00->rowIndex_ == 1) break;
LAB_0012c274:
    p_00 = (pointer)(p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
    if (p_00 == (pointer)(p_Var19 + 4)) goto LAB_0012c2a8;
  }
  plVar4 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_;
  plVar5 = (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_;
  plVar5->next_ = plVar4;
  plVar4->prev_ = plVar5;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (p_00->super_Column_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  Gudhi::
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>
  ::destroy((Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>
             *)p_Var19[3]._M_nxt,p_00);
LAB_0012c2a8:
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x270);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_1b8._M_bucket_count;
  uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar9,0);
  if (local_1b8._M_buckets[uVar18 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var19 = local_1b8._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var19[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        p_Var19 = p_Var19 + 4;
        p_Var16 = p_Var19;
        goto LAB_0012c332;
      }
      p_Var19 = p_Var19->_M_nxt;
    } while ((p_Var19 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var19[1]._M_nxt, (ulong)uVar1 % local_1b8._M_bucket_count == uVar18
            ));
  }
  std::__throw_out_of_range("_Map_base::at");
  while( true ) {
    if (p_Var16 == (_Hash_node_base *)0x0) goto LAB_0012c802;
    if (*(int *)&p_Var16[2]._M_nxt == 1) break;
LAB_0012c332:
    p_Var16 = p_Var16->_M_nxt;
    if (p_Var16 == p_Var19) break;
  }
  local_1f0[0] = (key_equal)(p_Var16 == p_Var19);
  local_1e8 = 0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = "m.is_zero_entry(3, 1)";
  local_1f8 = "";
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_001b8350;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_158 = &local_200;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x271);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_1b8._M_bucket_count;
  uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar10,0);
  if (local_1b8._M_buckets[uVar18 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var19 = local_1b8._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var19[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        local_1f0[0] = (key_equal)
                       (p_Var19[4]._M_nxt != p_Var19 + 4 &&
                       p_Var19[4]._M_nxt != (_Hash_node_base *)0x0);
        local_1e8 = 0;
        sStack_1e0.pi_ = (sp_counted_base *)0x0;
        local_200 = "!m.is_zero_column(3)";
        local_1f8 = "";
        local_168 = 0;
        local_170 = &PTR__lazy_ostream_001b8350;
        local_160 = &boost::unit_test::lazy_ostream::inst;
        local_158 = &local_200;
        local_f0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_e8 = "";
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_1e0);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = local_1b8._M_bucket_count;
        uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar11,0);
        if (local_1b8._M_buckets[uVar18 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0012c7f6;
        p_Var19 = local_1b8._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
        uVar1 = *(uint *)&p_Var19[1]._M_nxt;
        goto joined_r0x0012c521;
      }
      p_Var19 = p_Var19->_M_nxt;
    } while ((p_Var19 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var19[1]._M_nxt, (ulong)uVar1 % local_1b8._M_bucket_count == uVar18
            ));
  }
  std::__throw_out_of_range("_Map_base::at");
  while ((p_Var19 = p_Var19->_M_nxt, p_Var19 != (_Hash_node_base *)0x0 &&
         (uVar1 = *(uint *)&p_Var19[1]._M_nxt, (ulong)uVar1 % local_1b8._M_bucket_count == uVar18)))
  {
joined_r0x0012c246:
    if (uVar1 == 3) {
      p_00 = (pointer)(p_Var19 + 4);
      goto LAB_0012c274;
    }
  }
LAB_0012c7f6:
  std::__throw_out_of_range("_Map_base::at");
joined_r0x0012c521:
  if (uVar1 != 3) {
    p_Var19 = p_Var19->_M_nxt;
    if ((p_Var19 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var19[1]._M_nxt, (ulong)uVar1 % local_1b8._M_bucket_count != uVar18))
    goto LAB_0012c7f6;
    goto joined_r0x0012c521;
  }
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>::Delete_disposer>
            ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,true,false>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              *)(p_Var19 + 4),
             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>
              *)(p_Var19 + 2));
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x273);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_1b8._M_bucket_count;
  uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar12,0);
  if (local_1b8._M_buckets[uVar18 & 0xffffffff] == (__node_base_ptr)0x0) goto LAB_0012c851;
  p_Var19 = local_1b8._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
  uVar1 = *(uint *)&p_Var19[1]._M_nxt;
  while (uVar1 != 3) {
    p_Var19 = p_Var19->_M_nxt;
    if ((p_Var19 == (_Hash_node_base *)0x0) ||
       (uVar1 = *(uint *)&p_Var19[1]._M_nxt, (ulong)uVar1 % local_1b8._M_bucket_count != uVar18)) {
LAB_0012c851:
      std::__throw_out_of_range("_Map_base::at");
    }
  }
  p_Var19 = p_Var19 + 4;
  p_Var16 = p_Var19;
  do {
    p_Var16 = p_Var16->_M_nxt;
    if (p_Var16 == p_Var19) break;
    if (p_Var16 == (_Hash_node_base *)0x0) {
LAB_0012c802:
      __assert_fail("!!p","/usr/include/boost/intrusive/detail/hook_traits.hpp",0x3e,
                    "static pointer boost::intrusive::bhtraits_base<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false>>>, boost::intrusive::list_node<void *> *, Gudhi::persistence_matrix::Matrix<Base_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false>>::Matrix_column_tag, 1>::to_value_ptr(const node_ptr &) [T = Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<Base_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false>>>, NodePtr = boost::intrusive::list_node<void *> *, Tag = Gudhi::persistence_matrix::Matrix<Base_options<true, Gudhi::persistence_matrix::Column_types::INTRUSIVE_LIST, true, false>>::Matrix_column_tag, Type = 1]"
                   );
    }
  } while (*(int *)&p_Var16[2]._M_nxt != 1);
  local_1f0[0] = (key_equal)(p_Var16 == p_Var19);
  local_1e8 = 0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = "m.is_zero_entry(3, 1)";
  local_1f8 = "";
  local_168 = 0;
  local_170 = &PTR__lazy_ostream_001b8350;
  local_160 = &boost::unit_test::lazy_ostream::inst;
  local_158 = &local_200;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1e0);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x274);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_1b8._M_bucket_count;
  uVar18 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(3)) % auVar13,0);
  if (local_1b8._M_buckets[uVar18 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var19 = local_1b8._M_buckets[uVar18 & 0xffffffff]->_M_nxt;
    uVar1 = *(uint *)&p_Var19[1]._M_nxt;
    do {
      if (uVar1 == 3) {
        local_1f0[0] = (key_equal)
                       (p_Var19[4]._M_nxt == p_Var19 + 4 ||
                       p_Var19[4]._M_nxt == (_Hash_node_base *)0x0);
        local_1e8 = 0;
        sStack_1e0.pi_ = (sp_counted_base *)0x0;
        local_200 = "m.is_zero_column(3)";
        local_1f8 = "";
        local_168 = 0;
        local_170 = &PTR__lazy_ostream_001b8350;
        local_160 = &boost::unit_test::lazy_ostream::inst;
        local_158 = &local_200;
        local_150 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_148 = "";
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_1e0);
        ppVar15 = local_1c0;
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::clear(&local_1b8);
        ppVar14 = local_1c0;
        local_180 = 0;
        local_178 = ppVar15;
        if (local_1c0 != (pool<boost::default_user_allocator_malloc_free> *)0x0) {
          boost::pool<boost::default_user_allocator_malloc_free>::purge_memory(local_1c0);
        }
        operator_delete(ppVar14,0x38);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_1b8);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::~vector(&local_1d8);
        return;
      }
      p_Var19 = p_Var19->_M_nxt;
    } while ((p_Var19 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var19[1]._M_nxt, (ulong)uVar1 % local_1b8._M_bucket_count == uVar18
            ));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_zeroing() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  Matrix m(orderedBoundaries, 5);

  BOOST_CHECK(!m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_entry(3, 1);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_column(3);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(m.is_zero_column(3));
}